

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

PrefixedLogger * __thiscall
phosg::PrefixedLogger::subf
          (PrefixedLogger *__return_storage_ptr__,PrefixedLogger *this,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string prefix;
  va_list va;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  va[0].reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = &stack0x00000008;
  va[0].gp_offset = 0x18;
  va[0].fp_offset = 0x30;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  string_vprintf_abi_cxx11_(&prefix,(phosg *)fmt,(char *)va,(__va_list_tag *)0x3000000018);
  sub(__return_storage_ptr__,this,&prefix,USE_DEFAULT);
  ::std::__cxx11::string::~string((string *)&prefix);
  return __return_storage_ptr__;
}

Assistant:

PrefixedLogger PrefixedLogger::subf(const char* fmt, ...) const {
  va_list va;
  va_start(va, fmt);
  string prefix = string_vprintf(fmt, va);
  va_end(va);
  return this->sub(prefix);
}